

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute *a,xml_node *p,
          xpath_allocator *alloc)

{
  unspecified_bool_type p_Var1;
  xml_node local_48;
  xml_node cur;
  axis_t axis;
  xpath_allocator *alloc_local;
  xml_node *p_local;
  xml_attribute *a_local;
  xpath_node_set_raw *ns_local;
  xpath_ast_node *this_local;
  
  cur._root._4_4_ = 1;
  if (this->_test == '\x02') {
    step_push(this,ns,a,p,alloc);
  }
  local_48._root = p->_root;
  while( true ) {
    p_Var1 = xml_node::operator_cast_to_function_pointer(&local_48);
    if (p_Var1 == (unspecified_bool_type)0x0) break;
    step_push(this,ns,&local_48,alloc);
    local_48 = xml_node::parent(&local_48);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xml_attribute& a, const xml_node& p, xpath_allocator* alloc, T v)
		{
			const axis_t axis = T::axis;

			switch (axis)
			{
			case axis_ancestor:
			case axis_ancestor_or_self:
			{
				if (axis == axis_ancestor_or_self && _test == nodetest_type_node) // reject attributes based on principal node type test
					step_push(ns, a, p, alloc);

				xml_node cur = p;
				
				while (cur)
				{
					step_push(ns, cur, alloc);
					
					cur = cur.parent();
				}
				
				break;
			}

			case axis_descendant_or_self:
			case axis_self:
			{
				if (_test == nodetest_type_node) // reject attributes based on principal node type test
					step_push(ns, a, p, alloc);

				break;
			}

			case axis_following:
			{
				xml_node cur = p;
				
				for (;;)
				{
					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (cur && !cur.next_sibling()) cur = cur.parent();
						cur = cur.next_sibling();
						
						if (!cur) break;
					}

					step_push(ns, cur, alloc);
				}

				break;
			}

			case axis_parent:
			{
				step_push(ns, p, alloc);

				break;
			}

			case axis_preceding:
			{
				// preceding:: axis does not include attribute nodes and attribute ancestors (they are the same as parent's ancestors), so we can reuse node preceding
				step_fill(ns, p, alloc, v);
				break;
			}
			
			default:
				assert(!"Unimplemented axis");
			}
		}